

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

bool cmCTestScriptHandler::RunScript
               (cmCTest *ctest,cmMakefile *mf,string *sname,bool InProcess,int *returnValue)

{
  int iVar1;
  cmCTestScriptHandler *this;
  
  this = (cmCTestScriptHandler *)operator_new(0x338);
  cmCTestScriptHandler(this);
  (this->super_cmCTestGenericHandler).CTest = ctest;
  this->ParentMakefile = mf;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->ConfigurationScripts,sname);
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->ScriptProcessScope,InProcess);
  iVar1 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])(this);
  if (returnValue != (int *)0x0) {
    *returnValue = iVar1;
  }
  (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[5])(this);
  return true;
}

Assistant:

bool cmCTestScriptHandler::RunScript(cmCTest* ctest, cmMakefile* mf,
                                     const std::string& sname, bool InProcess,
                                     int* returnValue)
{
  auto sh = cm::make_unique<cmCTestScriptHandler>();
  sh->SetCTestInstance(ctest);
  sh->ParentMakefile = mf;
  sh->AddConfigurationScript(sname, InProcess);
  int res = sh->ProcessHandler();
  if (returnValue) {
    *returnValue = res;
  }
  return true;
}